

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestServiceWithCustomOptions::CallMethod
          (TestServiceWithCustomOptions *this,MethodDescriptor *method,RpcController *controller,
          Message *request,Message *response,Closure *done)

{
  Message *pMVar1;
  ServiceDescriptor **v1;
  ServiceDescriptor **v2;
  char *pcVar2;
  LogMessage *pLVar3;
  CustomOptionFooRequest *pCVar4;
  CustomOptionFooResponse *pCVar5;
  int __c;
  LogMessage local_80;
  Voidify local_6d [13];
  LogMessage local_60;
  Voidify local_49;
  ServiceDescriptor *local_48;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Closure *done_local;
  Message *response_local;
  Message *request_local;
  RpcController *controller_local;
  MethodDescriptor *method_local;
  TestServiceWithCustomOptions *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)done;
  done_local = (Closure *)response;
  response_local = request;
  request_local = (Message *)controller;
  controller_local = (RpcController *)method;
  method_local = (MethodDescriptor *)this;
  local_48 = google::protobuf::MethodDescriptor::service(method);
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ServiceDescriptor_const*>(&local_48);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ServiceDescriptor_const*>
                 (
                 file_level_service_descriptors_google_2fprotobuf_2funittest_5fcustom_5foptions_2eproto
                 );
  local_40 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::ServiceDescriptor_const*,google::protobuf::ServiceDescriptor_const*>
                       (v1,v2,
                        "method->service() == file_level_service_descriptors_google_2fprotobuf_2funittest_5fcustom_5foptions_2eproto[0]"
                       );
  if (local_40 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_40);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_custom_options.pb.cc"
               ,0x1c97,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_60);
  }
  pcVar2 = google::protobuf::MethodDescriptor::index
                     ((MethodDescriptor *)controller_local,(char *)v2,__c);
  pMVar1 = request_local;
  if ((int)pcVar2 == 0) {
    pCVar4 = google::protobuf::DownCastMessage<proto2_unittest::CustomOptionFooRequest>
                       (&response_local->super_MessageLite);
    pCVar5 = google::protobuf::DownCastMessage<proto2_unittest::CustomOptionFooResponse>
                       ((MessageLite *)done_local);
    (*(this->super_Service)._vptr_Service[6])
              (this,pMVar1,pCVar4,pCVar5,absl_log_internal_check_op_result);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_custom_options.pb.cc"
             ,0x1c9f);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar3,(char (*) [44])"Bad method index; this should never happen.");
  absl::lts_20250127::log_internal::Voidify::operator&&(local_6d,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

void TestServiceWithCustomOptions::CallMethod(
    const ::google::protobuf::MethodDescriptor* PROTOBUF_NONNULL method,
    ::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
    const ::google::protobuf::Message* PROTOBUF_NONNULL request,
    ::google::protobuf::Message* PROTOBUF_NONNULL response, ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  ABSL_DCHECK_EQ(method->service(), file_level_service_descriptors_google_2fprotobuf_2funittest_5fcustom_5foptions_2eproto[0]);
  switch (method->index()) {
    case 0:
      this->Foo(controller, ::google::protobuf::DownCastMessage<::proto2_unittest::CustomOptionFooRequest>(request),
                   ::google::protobuf::DownCastMessage<::proto2_unittest::CustomOptionFooResponse>(response), done);
      break;

    default:
      ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
      break;
  }
}